

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O1

void __thiscall StringTest::Test9(StringTest *this)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  string t1;
  string t2;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Hello World, I\'d like to look for a string","");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"or","");
  uVar1 = std::__cxx11::string::rfind((char *)local_68,(ulong)local_48[0],0xffffffffffffffff);
  if ((ulong)uVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x22d,"Failed to rfind last string( \"or\" )");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,(ulong)local_48[0],(ulong)uVar1);
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x234,"Failed to refind last string( \"or\" )");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,(ulong)local_48[0],(ulong)(iVar2 - 1));
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x23b,"Failed to rfind second string( \"or\" )");
  }
  uVar1 = std::__cxx11::string::rfind((char *)local_68,0x107bdd,0xffffffffffffffff);
  if ((ulong)uVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x240,"Failed to rfind first \"or\"");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,0x107bdd,(ulong)uVar1);
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x245,"Failed to rerfind first \"or\"");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,0x107bdd,(ulong)(iVar2 - 1));
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x24a,"Failed to rfind second \"or\"");
  }
  cVar3 = (char)local_68;
  iVar2 = std::__cxx11::string::rfind(cVar3,0x57);
  if (iVar2 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x24f,"Failed to rfind \'W\'");
  }
  iVar2 = std::__cxx11::string::rfind(cVar3,100);
  if (iVar2 != 0xf) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x254,"Failed to rfind first \'o\'");
  }
  iVar2 = std::__cxx11::string::rfind(cVar3,100);
  if (iVar2 != 10) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x259,"Failed to rfind second \'o\'");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,0x10779a,0xffffffffffffffff);
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x25e,"Failed to rfind first \"or\" (full)");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,0x10779a,0x1e);
  if (iVar2 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x263,"Failed to rfind second \"or\" (full)");
  }
  iVar2 = std::__cxx11::string::rfind((char *)local_68,0x10779a,0x1f);
  if (iVar2 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x268,"Failed to rerfind first \"or\" (full)");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void Test9()
	{
		// rfind
		string t1 = "Hello World, I'd like to look for a string";
		string t2 = "or";
		
		unsigned i = t1.rfind( t2 );
		
		if ( i != 31 )
			TestFailed( "Failed to rfind last string( \"or\" )" );
		
		i = t1.rfind( t2, i );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 31 )
			TestFailed( "Failed to refind last string( \"or\" )" );

		i = t1.rfind( t2, i - 1 );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 7 )
			TestFailed( "Failed to rfind second string( \"or\" )" );
		
		i = t1.rfind( "or" );

		if ( i != 31 )
			TestFailed( "Failed to rfind first \"or\"" );

		i = t1.rfind( "or", i );

		if ( i != 31 )
			TestFailed( "Failed to rerfind first \"or\"" );

		i = t1.rfind( "or", i - 1 );

		if ( i != 7 )
			TestFailed( "Failed to rfind second \"or\"" );

		i = t1.rfind( 'W' );

		if ( i != 6 )
			TestFailed( "Failed to rfind \'W\'" );

		i = t1.rfind( 'd', 31 );

		if ( i != 15 )
			TestFailed( "Failed to rfind first \'o\'" );
		
		i = t1.rfind( 'd', 14 );

		if ( i != 10 )
			TestFailed( "Failed to rfind second \'o\'" );
		
		i = t1.rfind( "orlando", string::npos, 2 );

		if ( i != 31 )
			TestFailed( "Failed to rfind first \"or\" (full)" );

		i = t1.rfind( "orlando", 30, 2 );

		if ( i != 7 )
			TestFailed( "Failed to rfind second \"or\" (full)" );

		i = t1.rfind( "orlando", 31, 2 );

		if ( i != 31 )
			TestFailed( "Failed to rerfind first \"or\" (full)" );
		
		TestPassed();
	}